

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheRelease(PgHdr *p)

{
  i16 *piVar1;
  int *piVar2;
  
  piVar1 = &p->nRef;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  piVar2 = &p->pCache->nRef;
  *piVar2 = *piVar2 + -1;
  if ((p->flags & 2) == 0) {
    pcacheUnpin(p);
    return;
  }
  pcacheRemoveFromDirtyList(p);
  pcacheAddToDirtyList(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->nRef--;
  if( p->nRef==0 ){
    PCache *pCache = p->pCache;
    pCache->nRef--;
    if( (p->flags&PGHDR_DIRTY)==0 ){
      pcacheUnpin(p);
    }else{
      /* Move the page to the head of the dirty list. */
      pcacheRemoveFromDirtyList(p);
      pcacheAddToDirtyList(p);
    }
  }
}